

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

bool __thiscall
axl::sl::Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>::
setCountImpl<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Construct>
          (Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
           *this,size_t count)

{
  bool bVar1;
  size_t sVar2;
  Hdr *pHVar3;
  Hdr *pHVar4;
  Hdr *this_00;
  Hdr *dst;
  ulong in_RSI;
  long *in_RDI;
  Ret *p;
  Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr> hdr;
  size_t bufferSize;
  bool result;
  size_t size;
  Hdr *in_stack_ffffffffffffff68;
  Hdr *in_stack_ffffffffffffff70;
  Ret *in_stack_ffffffffffffff78;
  Construct *in_stack_ffffffffffffff80;
  Ptr local_40 [16];
  size_t in_stack_ffffffffffffffd0;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  bool local_1;
  
  if ((in_RDI[1] != 0) && (sVar2 = rc::RefCount::getRefCount((RefCount *)in_RDI[1]), sVar2 == 1)) {
    if (in_RDI[2] == in_RSI) {
      return true;
    }
    if (in_RSI << 4 <= *(ulong *)(in_RDI[1] + 0x18)) {
      if ((ulong)in_RDI[2] < in_RSI) {
        ArrayDetails<axl::spy::ThreadState::Ret>::Construct::operator()
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                   (size_t)in_stack_ffffffffffffff70);
      }
      else {
        ArrayDetails<axl::spy::ThreadState::Ret>::destruct
                  ((Ret *)(*in_RDI + in_RSI * 0x10),in_RDI[2] - in_RSI);
      }
      ArrayDetails<axl::spy::ThreadState::Ret>::setHdrCount((Hdr *)in_RDI[1],in_RSI);
      in_RDI[2] = in_RSI;
      return true;
    }
  }
  if (in_RSI == 0) {
    ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>::
    release((ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
             *)in_stack_ffffffffffffff70);
    local_1 = true;
  }
  else if (in_RDI[2] == 0) {
    bVar1 = reserve((Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
                     *)CONCAT17(in_stack_ffffffffffffffdf,
                                CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)),
                    in_stack_ffffffffffffffd0);
    if (bVar1) {
      ArrayDetails<axl::spy::ThreadState::Ret>::Construct::operator()
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                 (size_t)in_stack_ffffffffffffff70);
      ArrayDetails<axl::spy::ThreadState::Ret>::setHdrCount((Hdr *)in_RDI[1],in_RSI);
      in_RDI[2] = in_RSI;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    getAllocSize(0x155c8e);
    pHVar3 = (Hdr *)mem::allocate(0x155ca1);
    ArrayDetails<axl::spy::ThreadState::Ret>::Hdr::Hdr
              (pHVar3,(size_t)in_stack_ffffffffffffff78,(uintptr_t)in_stack_ffffffffffffff70);
    rc::primeRefCount<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr>
              (in_stack_ffffffffffffff70,(FreeFunc *)in_stack_ffffffffffffff68);
    rc::Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr>::
    Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr>
              ((Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr> *)
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    pHVar4 = rc::Ptr::operator_cast_to_Hdr_(local_40);
    if (pHVar4 == (Hdr *)0x0) {
      local_1 = false;
    }
    else {
      pHVar4 = rc::Ptr::operator_cast_to_Hdr_(local_40);
      ArrayDetails<axl::spy::ThreadState::Ret>::setHdrCount(pHVar4,in_RSI);
      this_00 = rc::Ptr::operator_cast_to_Hdr_(local_40);
      dst = this_00 + 1;
      if ((ulong)in_RDI[2] < in_RSI) {
        ArrayDetails<axl::spy::ThreadState::Ret>::constructCopy((Ret *)dst,(Ret *)*in_RDI,in_RDI[2])
        ;
        ArrayDetails<axl::spy::ThreadState::Ret>::Construct::operator()
                  ((Construct *)pHVar3,(Ret *)pHVar4,(size_t)this_00);
      }
      else {
        ArrayDetails<axl::spy::ThreadState::Ret>::constructCopy((Ret *)dst,(Ret *)*in_RDI,in_RSI);
      }
      rc::RefCount::release((RefCount *)this_00);
      *in_RDI = (long)dst;
      pHVar3 = rc::Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr>::detach
                         ((Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr> *)pHVar3,
                          (RefCount **)pHVar4);
      in_RDI[1] = (long)pHVar3;
      in_RDI[2] = in_RSI;
      local_1 = true;
    }
    rc::Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr>::~Ptr
              ((Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr> *)0x155e4a);
  }
  return local_1;
}

Assistant:

bool
	setCountImpl(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1) {
			if (this->m_count == count)
				return true;

			if (this->m_hdr->m_bufferSize >= size) {
				if (count > this->m_count)
					Construct() (this->m_p + this->m_count, count - this->m_count);
				else
					Details::destruct(this->m_p + count, this->m_count - count);

				Details::setHdrCount(this->m_hdr, count);
				this->m_count = count;
				return true;
			}
		}

		if (count == 0) {
			this->release();
			return true;
		}

		if (!this->m_count) {
			bool result = reserve(count);
			if (!result)
				return false;

			Construct() (this->m_p, count);
			Details::setHdrCount(this->m_hdr, count);
			this->m_count = count;
			return true;
		}

		ASSERT(this->m_hdr);

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, count);

		T* p = (T*)(hdr + 1);

		if (count <= this->m_count) {
			Details::constructCopy(p, this->m_p, count);
		} else {
			Details::constructCopy(p, this->m_p, this->m_count);
			Construct() (p + this->m_count, count - this->m_count);
		}

		this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_count = count;
		return true;
	}